

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::SGXMLScanner::resolveSchemaGrammar
          (SGXMLScanner *this,XMLCh *loc,XMLCh *uri,bool ignoreLoadSchema)

{
  XMLBufferMgr *this_00;
  ReaderMgr *this_01;
  XMLCh XVar1;
  XMLCh XVar2;
  XMLEntityHandler *pXVar3;
  XMLStringPool *pXVar4;
  XMLValidator *pXVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  SchemaGrammar *this_02;
  undefined4 extraout_var;
  XMLBuffer *dstBuffer;
  XMLBuffer *this_03;
  undefined4 extraout_var_00;
  XMLBuffer *normalizedURI;
  URLInputSource *this_04;
  XMLCh *pXVar9;
  SchemaInfo *pSVar10;
  DOMDocument *pDVar11;
  DOMElement *schemaRoot;
  XMLCh *namespaceKey;
  XMLCh *pXVar12;
  undefined4 extraout_var_04;
  long *plVar13;
  XSModel *pXVar14;
  MalformedURLException *this_05;
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *schemaInfoList;
  XMLCh *pXVar15;
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *cachedSchemaInfoList;
  XMLBufBid bbSys;
  XMLBufBid nnSys;
  LastExtEntityInfo lastInfo;
  XMLBufBid ddSys;
  XSDDOMParser parser;
  XMLSchemaDescriptionImpl theSchemaDescription;
  RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> local_428;
  XMLBuffer *local_3f0;
  XMLBufferMgr *local_3e8;
  XSDDOMParser local_3e0;
  undefined1 local_268 [16];
  XMLCh *local_258;
  _func_int **local_250;
  RefArrayVectorOf<char16_t> *local_248;
  QName *local_240;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_05;
  
  XMLSchemaDescriptionImpl::XMLSchemaDescriptionImpl
            ((XMLSchemaDescriptionImpl *)local_268,uri,(this->super_XMLScanner).fMemoryManager);
  XMLSchemaDescriptionImpl::setLocationHints((XMLSchemaDescriptionImpl *)local_268,loc);
  this_02 = (SchemaGrammar *)
            GrammarResolver::getGrammar
                      ((this->super_XMLScanner).fGrammarResolver,(XMLGrammarDescription *)local_268)
  ;
  XMLSchemaDescriptionImpl::~XMLSchemaDescriptionImpl((XMLSchemaDescriptionImpl *)local_268);
  if ((this_02 != (SchemaGrammar *)0x0) &&
     (iVar7 = (*(this_02->super_Grammar).super_XSerializable._vptr_XSerializable[5])(this_02),
     iVar7 != 0)) {
    if ((this->super_XMLScanner).fHandleMultipleImports == true) {
      iVar7 = (*(this_02->super_Grammar).super_XSerializable._vptr_XSerializable[0x16])(this_02);
      iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0x38))
                        ((long *)CONCAT44(extraout_var,iVar7));
      if (iVar7 == 2) goto LAB_002af9c6;
    }
    if (((this->super_XMLScanner).fValScheme == Val_Auto) &&
       ((this->super_XMLScanner).fValidate == false)) {
      (this->super_XMLScanner).fValidate = true;
      (this->super_XMLScanner).fElemStack.fStack[(this->super_XMLScanner).fElemStack.fStackTop - 1]
      ->fValidationFlag = true;
    }
    if (this->fGrammarType == DTDGrammarType) {
      (this->super_XMLScanner).fGrammar = (Grammar *)this_02;
      this->fGrammarType = SchemaGrammarType;
      pXVar5 = (this->super_XMLScanner).fValidator;
      (*pXVar5->_vptr_XMLValidator[0xb])(pXVar5,this_02);
    }
    goto LAB_002b0178;
  }
LAB_002af9c6:
  if ((ignoreLoadSchema | (this->super_XMLScanner).fLoadSchema) != 1) goto LAB_002b0178;
  XSDDOMParser::XSDDOMParser
            (&local_3e0,(XMLValidator *)0x0,(this->super_XMLScanner).fMemoryManager,
             (XMLGrammarPool *)0x0);
  AbstractDOMParser::setValidationScheme((AbstractDOMParser *)&local_3e0,Val_Never);
  AbstractDOMParser::setDoNamespaces((AbstractDOMParser *)&local_3e0,true);
  XSDDOMParser::setUserEntityHandler(&local_3e0,(this->super_XMLScanner).fEntityHandler);
  XSDDOMParser::setUserErrorReporter(&local_3e0,(this->super_XMLScanner).fErrorReporter);
  this_00 = &(this->super_XMLScanner).fBufMgr;
  dstBuffer = XMLBufferMgr::bidOnBuffer(this_00);
  local_268._0_2_ = 0xffff;
  XMLString::removeChar(loc,(XMLCh *)local_268,dstBuffer);
  pXVar9 = dstBuffer->fBuffer;
  pXVar9[dstBuffer->fIndex] = L'\0';
  this_03 = XMLBufferMgr::bidOnBuffer(this_00);
  pXVar3 = (this->super_XMLScanner).fEntityHandler;
  if (pXVar3 == (XMLEntityHandler *)0x0) {
    this_03->fIndex = 0;
    if (*pXVar9 != L'\0') {
      XMLBuffer::append(this_03,pXVar9);
    }
LAB_002afbb0:
    if ((this->super_XMLScanner).fDisableDefaultEntityResolution != false) {
      XMLBufferMgr::releaseBuffer(this_00,this_03);
      XMLBufferMgr::releaseBuffer(this_00,dstBuffer);
      goto LAB_002afd9c;
    }
    ReaderMgr::getLastExtEntityInfo
              (&(this->super_XMLScanner).fReaderMgr,(LastExtEntityInfo *)&local_428);
    XMLURL::XMLURL((XMLURL *)local_268,(this->super_XMLScanner).fMemoryManager);
    pXVar9 = this_03->fBuffer;
    pXVar9[this_03->fIndex] = L'\0';
    bVar6 = XMLURL::setURL((XMLURL *)local_268,
                           (XMLCh *)local_428.super_XMLEnumerator<xercesc_4_0::SchemaInfo>.
                                    _vptr_XMLEnumerator,pXVar9,(XMLURL *)local_268);
    if ((!bVar6) || (bVar6 = XMLURL::isRelative((XMLURL *)local_268), bVar6)) {
      if ((this->super_XMLScanner).fStandardUriConformant != false) {
        this_05 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (this_05,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/SGXMLScanner.cpp"
                   ,0xe5b,URL_MalformedURL,(this->super_XMLScanner).fMemoryManager);
        goto LAB_002b01d4;
      }
      normalizedURI = XMLBufferMgr::bidOnBuffer(this_00);
      pXVar9 = this_03->fBuffer;
      pXVar9[this_03->fIndex] = L'\0';
      local_3f0 = normalizedURI;
      local_3e8 = this_00;
      XMLUri::normalizeURI(pXVar9,normalizedURI);
      this_04 = (URLInputSource *)
                XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
      pXVar9 = normalizedURI->fBuffer;
      pXVar9[normalizedURI->fIndex] = L'\0';
      LocalFileInputSource::LocalFileInputSource
                ((LocalFileInputSource *)this_04,
                 (XMLCh *)local_428.super_XMLEnumerator<xercesc_4_0::SchemaInfo>._vptr_XMLEnumerator
                 ,pXVar9,(this->super_XMLScanner).fMemoryManager);
      XMLBufferMgr::releaseBuffer(this_00,normalizedURI);
    }
    else {
      if (((this->super_XMLScanner).fStandardUriConformant == true) &&
         (bVar6 = XMLURL::hasInvalidChar((XMLURL *)local_268), bVar6)) {
        this_05 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (this_05,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/SGXMLScanner.cpp"
                   ,0xe60,URL_MalformedURL,(this->super_XMLScanner).fMemoryManager);
LAB_002b01d4:
        __cxa_throw(this_05,&MalformedURLException::typeinfo,XMLException::~XMLException);
      }
      this_04 = (URLInputSource *)
                XMemory::operator_new(0x88,(this->super_XMLScanner).fMemoryManager);
      URLInputSource::URLInputSource
                (this_04,(XMLURL *)local_268,(this->super_XMLScanner).fMemoryManager);
    }
    XMLURL::~XMLURL((XMLURL *)local_268);
  }
  else {
    iVar7 = (*pXVar3->_vptr_XMLEntityHandler[3])(pXVar3,pXVar9,this_03);
    if (((char)iVar7 == '\0') && (this_03->fIndex = 0, *pXVar9 != L'\0')) {
      XMLBuffer::append(this_03,pXVar9);
    }
    this_01 = &(this->super_XMLScanner).fReaderMgr;
    ReaderMgr::getLastExtEntityInfo(this_01,(LastExtEntityInfo *)&local_428);
    local_258 = this_03->fBuffer;
    local_258[this_03->fIndex] = L'\0';
    local_268._0_4_ = 0;
    local_268._8_8_ = &XMLUni::fgZeroLenString;
    local_250 = local_428.super_XMLEnumerator<xercesc_4_0::SchemaInfo>._vptr_XMLEnumerator;
    local_248 = (RefArrayVectorOf<char16_t> *)uri;
    local_240 = (QName *)this_01;
    iVar7 = (*((this->super_XMLScanner).fEntityHandler)->_vptr_XMLEntityHandler[5])();
    this_04 = (URLInputSource *)CONCAT44(extraout_var_00,iVar7);
    if (this_04 == (URLInputSource *)0x0) goto LAB_002afbb0;
  }
  iVar7 = (*(this_04->super_InputSource)._vptr_InputSource[5])(this_04);
  pXVar9 = (XMLCh *)CONCAT44(extraout_var_01,iVar7);
  if ((uri == (XMLCh *)0x0) || (*uri == L'\0')) {
    uVar8 = (this->super_XMLScanner).fEmptyNamespaceId;
  }
  else {
    uVar8 = (*(((this->super_XMLScanner).fURIStringPool)->super_XSerializable)._vptr_XSerializable
              [5])();
  }
  if ((((this->super_XMLScanner).fUseCachedGrammar == true) &&
      (pSVar10 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::get
                           (this->fCachedSchemaInfoList,pXVar9,uVar8), pSVar10 != (SchemaInfo *)0x0)
      ) || (((this->super_XMLScanner).fToCacheGrammar == false &&
            (pSVar10 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::get
                                 (this->fSchemaInfoList,pXVar9,uVar8), pSVar10 != (SchemaInfo *)0x0)
            ))) {
LAB_002afd74:
    (*(this_04->super_InputSource)._vptr_InputSource[1])(this_04);
    XMLBufferMgr::releaseBuffer(this_00,this_03);
    XMLBufferMgr::releaseBuffer(this_00,dstBuffer);
LAB_002afd9c:
    XSDDOMParser::~XSDDOMParser(&local_3e0);
    return;
  }
  uVar8 = (*(this_04->super_InputSource)._vptr_InputSource[6])(this_04);
  (*(this_04->super_InputSource)._vptr_InputSource[10])(this_04,0);
  AbstractDOMParser::parse((AbstractDOMParser *)&local_3e0,&this_04->super_InputSource);
  (*(this_04->super_InputSource)._vptr_InputSource[10])(this_04,(ulong)(uVar8 & 0xff));
  if ((local_3e0.fSawFatal == true) && ((this->super_XMLScanner).fExitOnFirstFatal == true)) {
    XMLScanner::emitError(&this->super_XMLScanner,SchemaScanFatalError);
  }
  pDVar11 = AbstractDOMParser::getDocument((AbstractDOMParser *)&local_3e0);
  if (pDVar11 != (DOMDocument *)0x0) {
    iVar7 = (*(pDVar11->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xd])(pDVar11);
    schemaRoot = (DOMElement *)CONCAT44(extraout_var_02,iVar7);
    if (schemaRoot != (DOMElement *)0x0) {
      iVar7 = (*(schemaRoot->super_DOMNode)._vptr_DOMNode[0x29])
                        (schemaRoot,SchemaSymbols::fgATT_TARGETNAMESPACE);
      namespaceKey = (XMLCh *)CONCAT44(extraout_var_03,iVar7);
      bVar6 = true;
      if (namespaceKey != uri) {
        pXVar12 = uri;
        if ((uri == (XMLCh *)0x0) || (pXVar15 = namespaceKey, namespaceKey == (XMLCh *)0x0)) {
          if (namespaceKey == (XMLCh *)0x0) {
            if (uri == (XMLCh *)0x0) goto LAB_002afeec;
LAB_002afea6:
            XVar1 = *pXVar12;
          }
          else {
            XVar1 = *namespaceKey;
            if ((uri != (XMLCh *)0x0) && (XVar1 == L'\0')) goto LAB_002afea6;
          }
          if (XVar1 == L'\0') goto LAB_002afeec;
        }
        else {
          do {
            XVar1 = *pXVar15;
            if (XVar1 == L'\0') goto LAB_002afea6;
            XVar2 = *pXVar12;
            pXVar12 = pXVar12 + 1;
            pXVar15 = pXVar15 + 1;
          } while (XVar1 == XVar2);
        }
        if (((this->super_XMLScanner).fValidate != false) ||
           ((this->super_XMLScanner).fValScheme == Val_Auto)) {
          XMLValidator::emitError
                    ((this->super_XMLScanner).fValidator,WrongTargetNamespace,loc,uri,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        this_02 = (SchemaGrammar *)
                  GrammarResolver::getGrammar
                            ((this->super_XMLScanner).fGrammarResolver,namespaceKey);
        bVar6 = false;
      }
LAB_002afeec:
      if ((this_02 == (SchemaGrammar *)0x0) ||
         (iVar7 = (*(this_02->super_Grammar).super_XSerializable._vptr_XSerializable[5])(this_02),
         iVar7 == 0)) {
LAB_002aff26:
        if (!bVar6) {
          if ((namespaceKey == (XMLCh *)0x0) || (*namespaceKey == L'\0')) {
            uVar8 = (this->super_XMLScanner).fEmptyNamespaceId;
          }
          else {
            pXVar4 = (this->super_XMLScanner).fURIStringPool;
            uVar8 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[5])(pXVar4,namespaceKey);
          }
          if ((((this->super_XMLScanner).fUseCachedGrammar == true) &&
              (pSVar10 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::
                         get(this->fCachedSchemaInfoList,pXVar9,uVar8), pSVar10 != (SchemaInfo *)0x0
              )) || (((this->super_XMLScanner).fToCacheGrammar == false &&
                     (pSVar10 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                                ::get(this->fSchemaInfoList,pXVar9,uVar8),
                     pSVar10 != (SchemaInfo *)0x0)))) goto LAB_002afd74;
        }
        if (((this->super_XMLScanner).fValScheme == Val_Auto) &&
           ((this->super_XMLScanner).fValidate == false)) {
          (this->super_XMLScanner).fValidate = true;
          (this->super_XMLScanner).fElemStack.fStack
          [(this->super_XMLScanner).fElemStack.fStackTop - 1]->fValidationFlag = true;
        }
        if (this_02 == (SchemaGrammar *)0x0) {
LAB_002affce:
          this_02 = (SchemaGrammar *)
                    XMemory::operator_new(0x98,(this->super_XMLScanner).fGrammarPoolMemoryManager);
          SchemaGrammar::SchemaGrammar(this_02,(this->super_XMLScanner).fGrammarPoolMemoryManager);
          bVar6 = false;
        }
        else {
          iVar7 = (*(this_02->super_Grammar).super_XSerializable._vptr_XSerializable[5])(this_02);
          bVar6 = true;
          if (iVar7 != 1) goto LAB_002affce;
        }
        iVar7 = (*(this_02->super_Grammar).super_XSerializable._vptr_XSerializable[0x16])(this_02);
        plVar13 = (long *)CONCAT44(extraout_var_05,iVar7);
        (**(code **)(*plVar13 + 0x68))(plVar13,3);
        (**(code **)(*plVar13 + 0x78))(plVar13,pXVar9);
        cachedSchemaInfoList = this->fSchemaInfoList;
        if ((this->super_XMLScanner).fUseCachedGrammar != false) {
          cachedSchemaInfoList = this->fCachedSchemaInfoList;
        }
        schemaInfoList = this->fSchemaInfoList;
        if ((this->super_XMLScanner).fToCacheGrammar != false) {
          schemaInfoList = this->fCachedSchemaInfoList;
        }
        TraverseSchema::TraverseSchema
                  ((TraverseSchema *)local_268,schemaRoot,(this->super_XMLScanner).fURIStringPool,
                   this_02,(this->super_XMLScanner).fGrammarResolver,cachedSchemaInfoList,
                   schemaInfoList,&this->super_XMLScanner,pXVar9,
                   (this->super_XMLScanner).fEntityHandler,(this->super_XMLScanner).fErrorReporter,
                   (this->super_XMLScanner).fMemoryManager,bVar6);
        RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::
        RefHash2KeysTableOfEnumerator
                  (&local_428,(&this->fSchemaInfoList)[(this->super_XMLScanner).fToCacheGrammar],
                   false,XMLPlatformUtils::fgMemoryManager);
        while ((local_428.fCurElem != (RefHash2KeysTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0 ||
               (local_428.fCurHash != (local_428.fToEnum)->fHashModulus))) {
          pSVar10 = RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                    ::nextElement(&local_428);
          pSVar10->fSchemaRootElement = (DOMElement *)0x0;
        }
        RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::
        ~RefHash2KeysTableOfEnumerator(&local_428);
        if (this->fGrammarType == DTDGrammarType) {
          (this->super_XMLScanner).fGrammar = &this_02->super_Grammar;
          this->fGrammarType = SchemaGrammarType;
          pXVar5 = (this->super_XMLScanner).fValidator;
          (*pXVar5->_vptr_XMLValidator[0xb])(pXVar5,this_02);
        }
        if ((this->super_XMLScanner).fValidate == true) {
          pXVar5 = (this->super_XMLScanner).fValidator;
          (*pXVar5->_vptr_XMLValidator[4])(pXVar5,0,0);
        }
        TraverseSchema::~TraverseSchema((TraverseSchema *)local_268);
      }
      else if ((this->super_XMLScanner).fHandleMultipleImports == true) {
        iVar7 = (*(this_02->super_Grammar).super_XSerializable._vptr_XSerializable[0x16])(this_02);
        iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar7) + 0x38))
                          ((long *)CONCAT44(extraout_var_04,iVar7));
        if (iVar7 == 2) goto LAB_002aff26;
      }
    }
  }
  (*(this_04->super_InputSource)._vptr_InputSource[1])(this_04);
  XMLBufferMgr::releaseBuffer(this_00,this_03);
  XMLBufferMgr::releaseBuffer(this_00,dstBuffer);
  XSDDOMParser::~XSDDOMParser(&local_3e0);
LAB_002b0178:
  if ((this->super_XMLScanner).fPSVIHandler != (PSVIHandler *)0x0) {
    pXVar14 = GrammarResolver::getXSModel((this->super_XMLScanner).fGrammarResolver);
    this->fModel = pXVar14;
  }
  return;
}

Assistant:

void SGXMLScanner::resolveSchemaGrammar(const XMLCh* const loc, const XMLCh* const uri, bool ignoreLoadSchema) {

    Grammar* grammar = 0;

    {
        XMLSchemaDescriptionImpl    theSchemaDescription(uri, fMemoryManager);
        theSchemaDescription.setLocationHints(loc);
        grammar = fGrammarResolver->getGrammar(&theSchemaDescription);
    }

    // If multi-import is enabled, make sure the existing grammar came
    // from the import directive. Otherwise we may end up reloading
    // the same schema that came from the external grammar pool. Ideally,
    // we would move fSchemaInfoList to XMLGrammarPool so that it survives
    // the destruction of the scanner in which case we could rely on the
    // same logic we use to weed out duplicate schemas below.
    //
    if (!grammar || grammar->getGrammarType() == Grammar::DTDGrammarType ||
        (getHandleMultipleImports() &&
         ((XMLSchemaDescription*)grammar->getGrammarDescription())->
         getContextType () == XMLSchemaDescription::CONTEXT_IMPORT))
    {
      if (fLoadSchema || ignoreLoadSchema)
      {
        XSDDOMParser parser(0, fMemoryManager, 0);

        parser.setValidationScheme(XercesDOMParser::Val_Never);
        parser.setDoNamespaces(true);
        parser.setUserEntityHandler(fEntityHandler);
        parser.setUserErrorReporter(fErrorReporter);

        //Normalize sysId
        XMLBufBid nnSys(&fBufMgr);
        XMLBuffer& normalizedSysId = nnSys.getBuffer();
        XMLString::removeChar(loc, 0xFFFF, normalizedSysId);
        const XMLCh* normalizedURI = normalizedSysId.getRawBuffer();

        // Create a buffer for expanding the system id
        XMLBufBid bbSys(&fBufMgr);
        XMLBuffer& expSysId = bbSys.getBuffer();

        //  Allow the entity handler to expand the system id if they choose
        //  to do so.
        InputSource* srcToFill = 0;
        if (fEntityHandler)
        {
            if (!fEntityHandler->expandSystemId(normalizedURI, expSysId))
                expSysId.set(normalizedURI);

            ReaderMgr::LastExtEntityInfo lastInfo;
            fReaderMgr.getLastExtEntityInfo(lastInfo);
            XMLResourceIdentifier resourceIdentifier(XMLResourceIdentifier::SchemaGrammar,
                            expSysId.getRawBuffer(), uri, XMLUni::fgZeroLenString, lastInfo.systemId,
                            &fReaderMgr);
            srcToFill = fEntityHandler->resolveEntity(&resourceIdentifier);
        }
        else
        {
            expSysId.set(normalizedURI);
        }

        //  If they didn't create a source via the entity handler, then we
        //  have to create one on our own.
        if (!srcToFill)
        {
            if (fDisableDefaultEntityResolution)
                return;

            ReaderMgr::LastExtEntityInfo lastInfo;
            fReaderMgr.getLastExtEntityInfo(lastInfo);

            XMLURL urlTmp(fMemoryManager);
            if ((!urlTmp.setURL(lastInfo.systemId, expSysId.getRawBuffer(), urlTmp)) ||
                (urlTmp.isRelative()))
            {
                if (!fStandardUriConformant)
                {
                    XMLBufBid  ddSys(&fBufMgr);
                    XMLBuffer& resolvedSysId = ddSys.getBuffer();
                    XMLUri::normalizeURI(expSysId.getRawBuffer(), resolvedSysId);

                    srcToFill = new (fMemoryManager) LocalFileInputSource
                    (
                        lastInfo.systemId
                        , resolvedSysId.getRawBuffer()
                        , fMemoryManager
                    );
                }
                else
                    ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);
            }
            else
            {
                if (fStandardUriConformant && urlTmp.hasInvalidChar())
                    ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);

                srcToFill = new (fMemoryManager) URLInputSource(urlTmp, fMemoryManager);
            }
        }

        // Put a janitor on the input source
        Janitor<InputSource> janSrc(srcToFill);

        // Check if this exact schema has already been seen.
        //
        const XMLCh* sysId = srcToFill->getSystemId();
        unsigned int uriId = (uri && *uri) ? fURIStringPool->addOrFind(uri) : fEmptyNamespaceId;
        SchemaInfo* importSchemaInfo = 0;

        if (fUseCachedGrammar)
          importSchemaInfo = fCachedSchemaInfoList->get(sysId, uriId);

        if (!importSchemaInfo && !fToCacheGrammar)
          importSchemaInfo = fSchemaInfoList->get(sysId, uriId);

        if (importSchemaInfo)
        {
          // We haven't added any new grammars so it is safe to just
          // return.
          //
          return;
        }

        // Should just issue warning if the schema is not found
        bool flag = srcToFill->getIssueFatalErrorIfNotFound();
        srcToFill->setIssueFatalErrorIfNotFound(false);

        parser.parse(*srcToFill);

        // Reset the InputSource
        srcToFill->setIssueFatalErrorIfNotFound(flag);

        if (parser.getSawFatal() && fExitOnFirstFatal)
            emitError(XMLErrs::SchemaScanFatalError);

        DOMDocument* document = parser.getDocument(); //Our Grammar

        if (document != 0) {

            DOMElement* root = document->getDocumentElement();// This is what we pass to TraverserSchema
            if (root != 0)
            {
                const XMLCh* newUri = root->getAttribute(SchemaSymbols::fgATT_TARGETNAMESPACE);
                bool newGrammar = false;
                if (!XMLString::equals(newUri, uri)) {
                    if (fValidate || fValScheme == Val_Auto) {
                        fValidator->emitError(XMLValid::WrongTargetNamespace, loc, uri);
                    }

                    grammar = fGrammarResolver->getGrammar(newUri);
                    newGrammar = true;
                }

                if (!grammar ||
                    grammar->getGrammarType() == Grammar::DTDGrammarType ||
                    (getHandleMultipleImports() &&
                     ((XMLSchemaDescription*) grammar->getGrammarDescription())->
                     getContextType () == XMLSchemaDescription::CONTEXT_IMPORT))
                {
                    // If we switched namespace URI, recheck the schema info.
                    //
                    if (newGrammar)
                    {
                      unsigned int newUriId = (newUri && *newUri) ? fURIStringPool->addOrFind(newUri) : fEmptyNamespaceId;

                      if (fUseCachedGrammar)
                        importSchemaInfo = fCachedSchemaInfoList->get(sysId, newUriId);

                      if (!importSchemaInfo && !fToCacheGrammar)
                        importSchemaInfo = fSchemaInfoList->get(sysId, newUriId);

                      if (importSchemaInfo)
                        return;
                    }

                    //  Since we have seen a grammar, set our validation flag
                    //  at this point if the validation scheme is auto
                    if (fValScheme == Val_Auto && !fValidate) {
                        fValidate = true;
                        fElemStack.setValidationFlag(fValidate);
                    }

                    bool grammarFound = grammar &&
                      grammar->getGrammarType() == Grammar::SchemaGrammarType;

                    SchemaGrammar* schemaGrammar;

                    if (grammarFound) {
                      schemaGrammar = (SchemaGrammar*) grammar;
                    }
                    else {
                      schemaGrammar = new (fGrammarPoolMemoryManager) SchemaGrammar(fGrammarPoolMemoryManager);
                    }

                    XMLSchemaDescription* gramDesc = (XMLSchemaDescription*) schemaGrammar->getGrammarDescription();

                    gramDesc->setContextType(XMLSchemaDescription::CONTEXT_PREPARSE);
                    gramDesc->setLocationHints(sysId);

                    TraverseSchema traverseSchema
                    (
                        root
                        , fURIStringPool
                        , schemaGrammar
                        , fGrammarResolver
                        , fUseCachedGrammar ? fCachedSchemaInfoList : fSchemaInfoList
                        , fToCacheGrammar ? fCachedSchemaInfoList : fSchemaInfoList
                        , this
                        , sysId
                        , fEntityHandler
                        , fErrorReporter
                        , fMemoryManager
                        , grammarFound
                    );

                    // Reset the now invalid schema roots in the collected
                    // schema info entries.
                    //
                    {
                      RefHash2KeysTableOfEnumerator<SchemaInfo> i (
                        fToCacheGrammar ? fCachedSchemaInfoList : fSchemaInfoList);

                      while (i.hasMoreElements ())
                        i.nextElement().resetRoot ();
                    }

                    if (fGrammarType == Grammar::DTDGrammarType) {
                        fGrammar = schemaGrammar;
                        fGrammarType = Grammar::SchemaGrammarType;
                        fValidator->setGrammar(fGrammar);
                    }

                    if (fValidate) {
                        //  validate the Schema scan so far
                        fValidator->preContentValidation(false);
                    }
                }
            }
        }
      }
    }
    else
    {
        //  Since we have seen a grammar, set our validation flag
        //  at this point if the validation scheme is auto
        if (fValScheme == Val_Auto && !fValidate) {
            fValidate = true;
            fElemStack.setValidationFlag(fValidate);
        }

        // we have seen a schema, so set up the fValidator as fSchemaValidator
        if (fGrammarType == Grammar::DTDGrammarType) {
            fGrammar = grammar;
            fGrammarType = Grammar::SchemaGrammarType;
            fValidator->setGrammar(fGrammar);
        }
    }
    // update fModel; rely on the grammar resolver to do this
    // efficiently
    if(getPSVIHandler())
        fModel = fGrammarResolver->getXSModel();
}